

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::Print(VirtualMachine *this)

{
  ostream *poVar1;
  element_type *peVar2;
  Variable VVar3;
  Variable var;
  string local_40;
  
  VVar3 = popOpStack(this);
  poVar1 = this->out;
  var._4_4_ = 0;
  var.type = VVar3.type;
  var.field_1.integerValue = VVar3.field_1.integerValue;
  variableToString_abi_cxx11_(&local_40,this,var,true);
  std::operator<<(poVar1,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  pushUndefined(this);
  peVar2 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2->programCounter = peVar2->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Print() {
  Variable var = this->popOpStack();
  this->out << this->variableToString(var, true);
  this->pushUndefined();
  this->advance();
}